

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_fail_example.cpp
# Opt level: O0

void foo2(int *a)

{
  ostream *poVar1;
  undefined1 local_28 [8];
  saver_fail<int_&> SAVER_FAIL_1;
  int *a_local;
  
  SAVER_FAIL_1.super_state_saver<int_&,_nstd::detail::on_fail_policy>._16_8_ = a;
  nstd::saver_fail<int_&>::state_saver((saver_fail<int_&> *)local_28,a);
  *(undefined4 *)SAVER_FAIL_1.super_state_saver<int_&,_nstd::detail::on_fail_policy>._16_8_ = 2;
  poVar1 = std::operator<<((ostream *)&std::cout,"foo2 a = ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(int *)SAVER_FAIL_1.
                                     super_state_saver<int_&,_nstd::detail::on_fail_policy>._16_8_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  nstd::saver_fail<int_&>::~saver_fail((saver_fail<int_&> *)local_28);
  return;
}

Assistant:

void foo2(int& a) {
  SAVER_FAIL(a); // State saver on fail.

  a = 2;
  std::cout << "foo2 a = " << a << std::endl;
  // Original state will not automatically restored, on scope leave when no exceptions have been thrown.
}